

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

bool __thiscall
units::fixed_precise_measurement::operator==(fixed_precise_measurement *this,double val)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = this->value_;
  if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) {
    dVar4 = dVar1 - val;
    if (((dVar4 != 0.0) || (NAN(dVar4))) &&
       ((NAN(dVar4) || (0xffffffffffffe < (long)ABS(dVar4) - 1U)))) {
      dVar4 = (double)((long)dVar1 + 0x800U & 0xfffffffffffff000);
      dVar2 = (double)((long)val + 0x800U & 0xfffffffffffff000);
      if ((dVar4 != dVar2) || (NAN(dVar4) || NAN(dVar2))) {
        dVar3 = (double)((long)(val * 1.0000000000005) + 0x800U & 0xfffffffffffff000);
        if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
          dVar3 = (double)((long)(val * 0.9999999999995) + 0x800U & 0xfffffffffffff000);
          if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
            dVar4 = (double)((long)(dVar1 * 1.0000000000005) + 0x800U & 0xfffffffffffff000);
            if ((dVar4 != dVar2) || (NAN(dVar4) || NAN(dVar2))) {
              return (bool)(-((double)((long)(dVar1 * 0.9999999999995) + 0x800U & 0xfffffffffffff000
                                      ) == dVar2) & 1);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool operator==(double val) const
    {
        return (value_ == val) ?
            true :
            detail::compare_round_equals_precise(value_, val);
    }